

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BBOrderGenerator.cpp
# Opt level: O0

vector<ASBlock_*,_std::allocator<ASBlock_*>_> * __thiscall
BBOrderGenerator::getASMBBOrder
          (vector<ASBlock_*,_std::allocator<ASBlock_*>_> *__return_storage_ptr__,
          BBOrderGenerator *this,
          map<Value_*,_ASValue_*,_std::less<Value_*>,_std::allocator<std::pair<Value_*const,_ASValue_*>_>_>
          *map)

{
  bool bVar1;
  reference ppBVar2;
  mapped_type *ppAVar3;
  value_type local_b0;
  BasicBlock *local_80;
  value_type local_78;
  ASBlock *asm_bb;
  BasicBlock *bb;
  iterator __end1;
  iterator __begin1;
  vector<BasicBlock_*,_std::allocator<BasicBlock_*>_> local_48;
  vector<BasicBlock_*,_std::allocator<BasicBlock_*>_> *local_30;
  vector<BasicBlock_*,_std::allocator<BasicBlock_*>_> *__range1;
  map<Value_*,_ASValue_*,_std::less<Value_*>,_std::allocator<std::pair<Value_*const,_ASValue_*>_>_>
  *local_20;
  map<Value_*,_ASValue_*,_std::less<Value_*>,_std::allocator<std::pair<Value_*const,_ASValue_*>_>_>
  *map_local;
  BBOrderGenerator *this_local;
  vector<ASBlock_*,_std::allocator<ASBlock_*>_> *ret;
  
  __range1._7_1_ = 0;
  local_20 = map;
  map_local = (map<Value_*,_ASValue_*,_std::less<Value_*>,_std::allocator<std::pair<Value_*const,_ASValue_*>_>_>
               *)this;
  this_local = (BBOrderGenerator *)__return_storage_ptr__;
  std::vector<ASBlock_*,_std::allocator<ASBlock_*>_>::vector(__return_storage_ptr__);
  getBBOrder(&local_48,this);
  local_30 = &local_48;
  __end1 = std::vector<BasicBlock_*,_std::allocator<BasicBlock_*>_>::begin(local_30);
  bb = (BasicBlock *)std::vector<BasicBlock_*,_std::allocator<BasicBlock_*>_>::end(local_30);
  while( true ) {
    bVar1 = __gnu_cxx::operator!=
                      (&__end1,(__normal_iterator<BasicBlock_**,_std::vector<BasicBlock_*,_std::allocator<BasicBlock_*>_>_>
                                *)&bb);
    if (!bVar1) {
      std::vector<BasicBlock_*,_std::allocator<BasicBlock_*>_>::~vector(&local_48);
      return __return_storage_ptr__;
    }
    ppBVar2 = __gnu_cxx::
              __normal_iterator<BasicBlock_**,_std::vector<BasicBlock_*,_std::allocator<BasicBlock_*>_>_>
              ::operator*(&__end1);
    local_80 = *ppBVar2;
    asm_bb = (ASBlock *)local_80;
    ppAVar3 = std::
              map<Value_*,_ASValue_*,_std::less<Value_*>,_std::allocator<std::pair<Value_*const,_ASValue_*>_>_>
              ::operator[](local_20,(key_type *)&local_80);
    if (*ppAVar3 == (mapped_type)0x0) {
      local_b0 = (value_type)0x0;
    }
    else {
      local_b0 = (value_type)__dynamic_cast(*ppAVar3,&ASValue::typeinfo,&ASBlock::typeinfo,0);
    }
    local_78 = local_b0;
    if (local_b0 == (value_type)0x0) break;
    std::vector<ASBlock_*,_std::allocator<ASBlock_*>_>::push_back(__return_storage_ptr__,&local_78);
    __gnu_cxx::
    __normal_iterator<BasicBlock_**,_std::vector<BasicBlock_*,_std::allocator<BasicBlock_*>_>_>::
    operator++(&__end1);
  }
  __assert_fail("asm_bb && \"Can\'t get ASM Block by BasicBlock\"",
                "/workspace/llm4binary/github/license_all_cmakelists_25/zhuez16[P]bazinga_compiler/src/ASMIR/BBOrderGenerator.cpp"
                ,0x52,
                "std::vector<ASBlock *> BBOrderGenerator::getASMBBOrder(std::map<Value *, ASValue *> &)"
               );
}

Assistant:

std::vector<ASBlock *> BBOrderGenerator::getASMBBOrder(std::map<Value *, ASValue *> &map) {
    {
        std::vector<ASBlock *> ret;
        for (auto bb: getBBOrder()) {
            auto asm_bb = dynamic_cast<ASBlock *>(map[bb]);
            assert(asm_bb && "Can't get ASM Block by BasicBlock");
            ret.push_back(asm_bb);
        }
        return ret;
    }
}